

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

DefaultCoverageBinInitializerSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefaultCoverageBinInitializerSyntax,slang::syntax::DefaultCoverageBinInitializerSyntax_const&>
          (BumpAllocator *this,DefaultCoverageBinInitializerSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  SyntaxKind SVar11;
  undefined4 uVar12;
  DefaultCoverageBinInitializerSyntax *pDVar13;
  
  pDVar13 = (DefaultCoverageBinInitializerSyntax *)
            ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DefaultCoverageBinInitializerSyntax *)this->endPtr < pDVar13 + 1) {
    pDVar13 = (DefaultCoverageBinInitializerSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pDVar13 + 1);
  }
  (pDVar13->sequenceKeyword).info = (args->sequenceKeyword).info;
  SVar11 = (args->super_CoverageBinInitializerSyntax).super_SyntaxNode.kind;
  uVar12 = *(undefined4 *)&(args->super_CoverageBinInitializerSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_CoverageBinInitializerSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_CoverageBinInitializerSyntax).super_SyntaxNode.previewNode;
  TVar7 = (args->defaultKeyword).kind;
  uVar8 = (args->defaultKeyword).field_0x2;
  NVar9.raw = (args->defaultKeyword).numFlags.raw;
  uVar10 = (args->defaultKeyword).rawLen;
  TVar3 = (args->sequenceKeyword).kind;
  uVar4 = (args->sequenceKeyword).field_0x2;
  NVar5.raw = (args->sequenceKeyword).numFlags.raw;
  uVar6 = (args->sequenceKeyword).rawLen;
  (pDVar13->defaultKeyword).info = (args->defaultKeyword).info;
  (pDVar13->sequenceKeyword).kind = TVar3;
  (pDVar13->sequenceKeyword).field_0x2 = uVar4;
  (pDVar13->sequenceKeyword).numFlags = (NumericTokenFlags)NVar5.raw;
  (pDVar13->sequenceKeyword).rawLen = uVar6;
  (pDVar13->super_CoverageBinInitializerSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pDVar13->defaultKeyword).kind = TVar7;
  (pDVar13->defaultKeyword).field_0x2 = uVar8;
  (pDVar13->defaultKeyword).numFlags = (NumericTokenFlags)NVar9.raw;
  (pDVar13->defaultKeyword).rawLen = uVar10;
  (pDVar13->super_CoverageBinInitializerSyntax).super_SyntaxNode.kind = SVar11;
  *(undefined4 *)&(pDVar13->super_CoverageBinInitializerSyntax).super_SyntaxNode.field_0x4 = uVar12;
  (pDVar13->super_CoverageBinInitializerSyntax).super_SyntaxNode.parent = pSVar1;
  return pDVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }